

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

char16 * __thiscall Js::AsmJsType::toChars(AsmJsType *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsmJsType *this_local;
  
  switch(this->which_) {
  case Int:
    this_local = (AsmJsType *)0x18bba26;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x3f,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local = (AsmJsType *)anon_var_dwarf_12c7cd8;
    break;
  case Double:
    this_local = (AsmJsType *)anon_var_dwarf_309444a;
    break;
  case Float:
    this_local = (AsmJsType *)0x18bc512;
    break;
  case MaybeDouble:
    this_local = (AsmJsType *)anon_var_dwarf_3094469;
    break;
  case DoubleLit:
    this_local = (AsmJsType *)anon_var_dwarf_309447f;
    break;
  case MaybeFloat:
    this_local = (AsmJsType *)anon_var_dwarf_30944d7;
    break;
  case Floatish:
    this_local = (AsmJsType *)anon_var_dwarf_30944ab;
    break;
  case FloatishDoubleLit:
    this_local = (AsmJsType *)anon_var_dwarf_30944c1;
    break;
  case Fixnum:
    this_local = (AsmJsType *)anon_var_dwarf_30944e1;
    break;
  case Signed:
    this_local = (AsmJsType *)0x18bc494;
    break;
  case Unsigned:
    this_local = (AsmJsType *)anon_var_dwarf_309450b;
    break;
  case Intish:
    this_local = (AsmJsType *)0x18bb5c0;
    break;
  case Void:
    this_local = (AsmJsType *)0x19a35a0;
    break;
  case Int32x4:
    this_local = (AsmJsType *)anon_var_dwarf_3094535;
    break;
  case Uint32x4:
    this_local = (AsmJsType *)anon_var_dwarf_30945b3;
    break;
  case Int16x8:
    this_local = (AsmJsType *)anon_var_dwarf_309459f;
    break;
  case Int8x16:
    this_local = (AsmJsType *)anon_var_dwarf_30945a9;
    break;
  case Uint16x8:
    this_local = (AsmJsType *)anon_var_dwarf_30945bd;
    break;
  case Uint8x16:
    this_local = (AsmJsType *)anon_var_dwarf_30945c7;
    break;
  case Bool32x4:
    this_local = (AsmJsType *)anon_var_dwarf_3094555;
    break;
  case Bool16x8:
    this_local = (AsmJsType *)anon_var_dwarf_309456b;
    break;
  case Bool8x16:
    this_local = (AsmJsType *)anon_var_dwarf_3094575;
    break;
  case Float32x4:
    this_local = (AsmJsType *)anon_var_dwarf_309457f;
    break;
  case Float64x2:
    this_local = (AsmJsType *)anon_var_dwarf_3094595;
    break;
  case Int64x2:
    this_local = (AsmJsType *)anon_var_dwarf_309454b;
  }
  return (char16 *)this_local;
}

Assistant:

const char16 * AsmJsType::toChars() const
    {
        switch (which_)
        {
        case Double:      return _u("double");
        case MaybeDouble: return _u("double?");
        case DoubleLit:   return _u("doublelit");
        case Float:       return _u("float");
        case Floatish:    return _u("floatish");
        case FloatishDoubleLit: return _u("FloatishDoubleLit");
        case MaybeFloat:  return _u("float?");
        case Fixnum:      return _u("fixnum");
        case Int:         return _u("int");
        case Signed:      return _u("signed");
        case Unsigned:    return _u("unsigned");
        case Intish:      return _u("intish");
        case Void:        return _u("void");
        case Int32x4:     return _u("SIMD.Int32x4");
        case Int64x2:     return _u("SIMD.Int64x2");
        case Bool32x4:    return _u("SIMD.Bool32x4");
        case Bool16x8:    return _u("SIMD.Bool16x8");
        case Bool8x16:    return _u("SIMD.Bool8x16");
        case Float32x4:   return _u("SIMD.Float32x4");
        case Float64x2:   return _u("SIMD.Float64x2");
        case Int16x8:     return _u("SIMD.Int16x8");
        case Int8x16:     return _u("SIMD.Int8x16");
        case Uint32x4:    return _u("SIMD.Uint32x4");
        case Uint16x8:    return _u("SIMD.Uint16x8");
        case Uint8x16:    return _u("SIMD.Uint8x16");
        }
        Assert(false);
        return _u("none");
    }